

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeNF
          (ChElementBeamTaperedTimoshenko *this,double U,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  ShapeFunctionGroup NN;
  ShapeFunctionN N;
  assign_op<double,_double> local_6d1;
  Product<Eigen::Transpose<Eigen::Matrix<double,_6,_12,_1,_6,_12>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_6d0;
  ShapeFunctionGroup local_6c0;
  Matrix<double,_6,_12,_1,_6,_12> local_2c0;
  
  ShapeFunctionsTimoshenko(this,&local_6c0,U);
  memcpy(&local_2c0,
         &local_6c0.
          super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
          .super__Head_base<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_false>,0x240);
  *detJ = (this->super_ChElementBeam).length * 0.5;
  if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 6) {
    local_6d0.m_lhs.m_matrix = &local_2c0;
    local_6d0.m_rhs = F;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,12,1,6,12>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
              (Qi,&local_6d0,&local_6d1,(type)0x0);
    return;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, 6, 12, 1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, 6, 12, 1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
               );
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeNF(const double U,
                                               ChVectorDynamic<>& Qi,
                                               double& detJ,
                                               const ChVectorDynamic<>& F,
                                               ChVectorDynamic<>* state_x,
                                               ChVectorDynamic<>* state_w) {
    ShapeFunctionGroup NN;
    ShapeFunctionsTimoshenko(NN, U);
    ShapeFunctionN N = std::get<0>(NN);

    // eta = 2*x/L;
    // ---> Deta/dx = 2./L;
    // ---> detJ = dx/Deta = L/2.;
    detJ = this->GetRestLength() / 2.0;

    Qi = N.transpose() * F;
}